

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFraig.c
# Opt level: O0

Abc_Obj_t * Abc_NodeFromFraig_rec(Abc_Ntk_t *pNtkNew,Fraig_Node_t *pNodeFraig)

{
  uint uVar1;
  Fraig_Node_t *p;
  Fraig_Node_t *pFVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *p1;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *local_60;
  void **ppTail;
  Fraig_Node_t *pNodeFraigR;
  Fraig_Node_t *pNodeTemp;
  Abc_Obj_t *pResCur;
  Abc_Obj_t *pResMin;
  Abc_Obj_t *pRes1;
  Abc_Obj_t *pRes0;
  Abc_Obj_t *pRes;
  Fraig_Node_t *pNodeFraig_local;
  Abc_Ntk_t *pNtkNew_local;
  
  p = (Fraig_Node_t *)((ulong)pNodeFraig & 0xfffffffffffffffe);
  pFVar2 = Fraig_NodeReadData1(p);
  if (pFVar2 == (Fraig_Node_t *)0x0) {
    pFVar2 = Fraig_NodeReadOne(p);
    pAVar3 = Abc_NodeFromFraig_rec(pNtkNew,pFVar2);
    pFVar2 = Fraig_NodeReadTwo(p);
    p1 = Abc_NodeFromFraig_rec(pNtkNew,pFVar2);
    pRes0 = Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc,pAVar3,p1);
    uVar1 = Fraig_NodeReadSimInv(p);
    *(uint *)&pRes0->field_0x14 = *(uint *)&pRes0->field_0x14 & 0xffffff7f | (uVar1 & 1) << 7;
    pFVar2 = Fraig_NodeReadRepr(p);
    if ((pFVar2 == (Fraig_Node_t *)0x0) &&
       (pFVar2 = Fraig_NodeReadNextE(p), pFVar2 != (Fraig_Node_t *)0x0)) {
      pNodeFraigR = Fraig_NodeReadNextE(p);
      pResCur = pRes0;
      for (; pNodeFraigR != (Fraig_Node_t *)0x0; pNodeFraigR = Fraig_NodeReadNextE(pNodeFraigR)) {
        pFVar2 = Fraig_NodeReadData1(pNodeFraigR);
        if (pFVar2 != (Fraig_Node_t *)0x0) {
          __assert_fail("Fraig_NodeReadData1(pNodeTemp) == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcFraig.c"
                        ,0x152,"Abc_Obj_t *Abc_NodeFromFraig_rec(Abc_Ntk_t *, Fraig_Node_t *)");
        }
        pAVar3 = Abc_NodeFromFraig_rec(pNtkNew,pNodeFraigR);
        if (*(uint *)&pAVar3->field_0x14 >> 0xc < *(uint *)&pResCur->field_0x14 >> 0xc) {
          pResCur = pAVar3;
        }
      }
      local_60 = &pResCur->field_5;
      if (pRes0 != pResCur) {
        local_60->pData = pRes0;
        local_60 = &pRes0->field_5;
      }
      for (pNodeFraigR = Fraig_NodeReadNextE(p); pNodeFraigR != (Fraig_Node_t *)0x0;
          pNodeFraigR = Fraig_NodeReadNextE(pNodeFraigR)) {
        pFVar2 = Fraig_NodeReadData1(pNodeFraigR);
        if (pFVar2 == (Fraig_Node_t *)0x0) {
          __assert_fail("pResCur",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcFraig.c"
                        ,0x161,"Abc_Obj_t *Abc_NodeFromFraig_rec(Abc_Ntk_t *, Fraig_Node_t *)");
        }
        if ((Fraig_Node_t *)pResCur != pFVar2) {
          local_60->pData = pFVar2;
          local_60 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *)&pFVar2->pNextS;
        }
      }
      if (local_60->pData != (void *)0x0) {
        __assert_fail("*ppTail == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcFraig.c"
                      ,0x167,"Abc_Obj_t *Abc_NodeFromFraig_rec(Abc_Ntk_t *, Fraig_Node_t *)");
      }
      pRes0 = Abc_ObjNotCond(pResCur,*(uint *)&pRes0->field_0x14 >> 7 & 1 ^
                                     *(uint *)&pResCur->field_0x14 >> 7 & 1);
    }
    Fraig_NodeSetData1(p,(Fraig_Node_t *)pRes0);
    pNtkNew_local = (Abc_Ntk_t *)Abc_ObjNotCond(pRes0,(uint)pNodeFraig & 1);
  }
  else {
    pNtkNew_local = (Abc_Ntk_t *)Abc_ObjNotCond((Abc_Obj_t *)pFVar2,(uint)pNodeFraig & 1);
  }
  return (Abc_Obj_t *)pNtkNew_local;
}

Assistant:

Abc_Obj_t * Abc_NodeFromFraig_rec( Abc_Ntk_t * pNtkNew, Fraig_Node_t * pNodeFraig )
{
    Abc_Obj_t * pRes, * pRes0, * pRes1, * pResMin, * pResCur;
    Fraig_Node_t * pNodeTemp, * pNodeFraigR = Fraig_Regular(pNodeFraig);
    void ** ppTail;
    // check if the node was already considered
    if ( (pRes = (Abc_Obj_t *)Fraig_NodeReadData1(pNodeFraigR)) )
        return Abc_ObjNotCond( pRes, Fraig_IsComplement(pNodeFraig) );
    // solve the children
    pRes0 = Abc_NodeFromFraig_rec( pNtkNew, Fraig_NodeReadOne(pNodeFraigR) );
    pRes1 = Abc_NodeFromFraig_rec( pNtkNew, Fraig_NodeReadTwo(pNodeFraigR) );
    // derive the new node
    pRes = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, pRes0, pRes1 );
    pRes->fPhase = Fraig_NodeReadSimInv( pNodeFraigR );
    // if the node has an equivalence class, find its representative
    if ( Fraig_NodeReadRepr(pNodeFraigR) == NULL && Fraig_NodeReadNextE(pNodeFraigR) != NULL )
    {
        // go through the FRAIG nodes belonging to this equivalence class
        // and find the representative node (the node with the smallest level)
        pResMin = pRes;
        for ( pNodeTemp = Fraig_NodeReadNextE(pNodeFraigR); pNodeTemp; pNodeTemp = Fraig_NodeReadNextE(pNodeTemp) )
        {
            assert( Fraig_NodeReadData1(pNodeTemp) == NULL );
            pResCur = Abc_NodeFromFraig_rec( pNtkNew, pNodeTemp );
            if ( pResMin->Level > pResCur->Level )
                pResMin = pResCur;
        }
        // link the nodes in such a way that representative goes first
        ppTail = &pResMin->pData;
        if ( pRes != pResMin )
        {
            *ppTail = pRes;
            ppTail = &pRes->pData;
        }
        for ( pNodeTemp = Fraig_NodeReadNextE(pNodeFraigR); pNodeTemp; pNodeTemp = Fraig_NodeReadNextE(pNodeTemp) )
        {
            pResCur = (Abc_Obj_t *)Fraig_NodeReadData1(pNodeTemp);
            assert( pResCur );
            if ( pResMin == pResCur )
                continue;
            *ppTail = pResCur;
            ppTail = &pResCur->pData;
        }
        assert( *ppTail == NULL );

        // update the phase of the node
        pRes = Abc_ObjNotCond( pResMin, (pRes->fPhase ^ pResMin->fPhase) );
    }
    Fraig_NodeSetData1( pNodeFraigR, (Fraig_Node_t *)pRes );
    return Abc_ObjNotCond( pRes, Fraig_IsComplement(pNodeFraig) );
}